

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O0

void __thiscall spirv_cross::Parser::parse(Parser *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar4;
  CompilerError *pCVar5;
  uint *puVar6;
  iterator iVar7;
  iterator iVar8;
  iterator iVar9;
  reference pvVar10;
  size_type sVar11;
  Instruction *pIVar12;
  pair<unsigned_int,_unsigned_int> *ppVar13;
  SPIRType *pSVar14;
  SPIRType *pSVar15;
  SPIRType *source;
  SPIRType *target;
  pair<unsigned_int,_unsigned_int> *fixup;
  pair<unsigned_int,_unsigned_int> *__end1_1;
  pair<unsigned_int,_unsigned_int> *__begin1_1;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *__range1_1;
  Instruction *i;
  Instruction *__end1;
  Instruction *__begin1;
  SmallVector<spirv_cross::Instruction,_8UL> *__range1;
  int local_f0;
  Instruction instr;
  SmallVector<spirv_cross::Instruction,_8UL> instructions;
  uint32_t offset;
  uint32_t MaximumNumberOfIDs;
  uint32_t bound;
  uint *s;
  size_type len;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv;
  Parser *this_local;
  
  this_00 = &(this->ir).spirv;
  sVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
  if (sVar4 < 5) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar5,"SPIRV file too small.");
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  puVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(this_00);
  uVar3 = *puVar6;
  uVar2 = swap_endian(0x7230203);
  if (uVar3 == uVar2) {
    iVar7 = ::std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    iVar8 = ::std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    iVar9 = ::std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
    ::std::
    transform<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,spirv_cross::Parser::parse()::__0>
              (iVar7._M_current,iVar8._M_current,iVar9._M_current);
  }
  if (*puVar6 == 0x7230203) {
    bVar1 = is_valid_spirv_version(puVar6[1]);
    if (bVar1) {
      if (0x3fffff < puVar6[3]) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"ID bound exceeds limit of 0x3fffff.\n");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ParsedIR::set_id_bounds(&this->ir,puVar6[3]);
      instructions.stack_storage.aligned_char[0x5c] = '\x05';
      instructions.stack_storage.aligned_char[0x5d] = '\0';
      instructions.stack_storage.aligned_char[0x5e] = '\0';
      instructions.stack_storage.aligned_char[0x5f] = '\0';
      SmallVector<spirv_cross::Instruction,_8UL>::SmallVector
                ((SmallVector<spirv_cross::Instruction,_8UL> *)&instr.offset);
      while ((uint)instructions.stack_storage.aligned_char._92_4_ < sVar4) {
        memset((void *)((long)&__range1 + 4),0,0xc);
        Instruction::Instruction((Instruction *)((long)&__range1 + 4));
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                             (ulong)(uint)instructions.stack_storage.aligned_char._92_4_);
        __range1._4_2_ = (undefined2)*pvVar10;
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                             (ulong)(uint)instructions.stack_storage.aligned_char._92_4_);
        __range1._6_2_ = (ushort)(*pvVar10 >> 0x10);
        if (__range1._6_2_ == 0) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar5,"SPIR-V instructions cannot consume 0 words. Invalid SPIR-V file.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        local_f0 = instructions.stack_storage.aligned_char._92_4_ + 1;
        instr._0_4_ = __range1._6_2_ - 1;
        instructions.stack_storage.aligned_char._92_4_ =
             (uint)__range1._6_2_ + instructions.stack_storage.aligned_char._92_4_;
        sVar11 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
        if (sVar11 < (uint)instructions.stack_storage.aligned_char._92_4_) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar5,"SPIR-V instruction goes out of bounds.");
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        SmallVector<spirv_cross::Instruction,_8UL>::push_back
                  ((SmallVector<spirv_cross::Instruction,_8UL> *)&instr.offset,
                   (Instruction *)((long)&__range1 + 4));
      }
      __end1 = VectorView<spirv_cross::Instruction>::begin
                         ((VectorView<spirv_cross::Instruction> *)&instr.offset);
      pIVar12 = VectorView<spirv_cross::Instruction>::end
                          ((VectorView<spirv_cross::Instruction> *)&instr.offset);
      for (; __end1 != pIVar12; __end1 = __end1 + 1) {
        parse(this,__end1);
      }
      __end1_1 = (pair<unsigned_int,_unsigned_int> *)
                 VectorView<std::pair<unsigned_int,_unsigned_int>_>::begin
                           (&(this->forward_pointer_fixups).
                             super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
      ppVar13 = VectorView<std::pair<unsigned_int,_unsigned_int>_>::end
                          (&(this->forward_pointer_fixups).
                            super_VectorView<std::pair<unsigned_int,_unsigned_int>_>);
      for (; __end1_1 != (pair<unsigned_int,_unsigned_int> *)ppVar13; __end1_1 = __end1_1 + 1) {
        pSVar14 = get<spirv_cross::SPIRType>(this,__end1_1->first);
        pSVar15 = get<spirv_cross::SPIRType>(this,__end1_1->second);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  (&pSVar14->member_types,&pSVar15->member_types);
        pSVar14->basetype = pSVar15->basetype;
        (pSVar14->super_IVariant).self.id = (pSVar15->super_IVariant).self.id;
      }
      SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::clear(&this->forward_pointer_fixups);
      if (this->current_function != (SPIRFunction *)0x0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Function was not terminated.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (this->current_block != (SPIRBlock *)0x0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"Block was not terminated.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this->ir).default_entry_point);
      if (uVar3 == 0) {
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar5,"There is no entry point in the SPIR-V module.");
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      SmallVector<spirv_cross::Instruction,_8UL>::~SmallVector
                ((SmallVector<spirv_cross::Instruction,_8UL> *)&instr.offset);
      return;
    }
  }
  pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(pCVar5,"Invalid SPIRV format.");
  __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void Parser::parse()
{
	auto &spirv = ir.spirv;

	auto len = spirv.size();
	if (len < 5)
		SPIRV_CROSS_THROW("SPIRV file too small.");

	auto s = spirv.data();

	// Endian-swap if we need to.
	if (s[0] == swap_endian(MagicNumber))
		transform(begin(spirv), end(spirv), begin(spirv), [](uint32_t c) { return swap_endian(c); });

	if (s[0] != MagicNumber || !is_valid_spirv_version(s[1]))
		SPIRV_CROSS_THROW("Invalid SPIRV format.");

	uint32_t bound = s[3];

	const uint32_t MaximumNumberOfIDs = 0x3fffff;
	if (bound > MaximumNumberOfIDs)
		SPIRV_CROSS_THROW("ID bound exceeds limit of 0x3fffff.\n");

	ir.set_id_bounds(bound);

	uint32_t offset = 5;

	SmallVector<Instruction> instructions;
	while (offset < len)
	{
		Instruction instr = {};
		instr.op = spirv[offset] & 0xffff;
		instr.count = (spirv[offset] >> 16) & 0xffff;

		if (instr.count == 0)
			SPIRV_CROSS_THROW("SPIR-V instructions cannot consume 0 words. Invalid SPIR-V file.");

		instr.offset = offset + 1;
		instr.length = instr.count - 1;

		offset += instr.count;

		if (offset > spirv.size())
			SPIRV_CROSS_THROW("SPIR-V instruction goes out of bounds.");

		instructions.push_back(instr);
	}

	for (auto &i : instructions)
		parse(i);

	for (auto &fixup : forward_pointer_fixups)
	{
		auto &target = get<SPIRType>(fixup.first);
		auto &source = get<SPIRType>(fixup.second);
		target.member_types = source.member_types;
		target.basetype = source.basetype;
		target.self = source.self;
	}
	forward_pointer_fixups.clear();

	if (current_function)
		SPIRV_CROSS_THROW("Function was not terminated.");
	if (current_block)
		SPIRV_CROSS_THROW("Block was not terminated.");
	if (ir.default_entry_point == 0)
		SPIRV_CROSS_THROW("There is no entry point in the SPIR-V module.");
}